

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_as_json_spacing(void)

{
  int iVar1;
  int iVar2;
  uint __fd;
  char *pcVar3;
  undefined8 *__n;
  long lVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  void *__s1;
  void *__s2;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  uint uVar11;
  undefined8 *puVar12;
  int *unaff_R12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  uint *__seed;
  size_t len;
  bson_t d;
  undefined1 auStack_cbc [12];
  undefined8 *puStack_cb0;
  undefined8 *puStack_ca8;
  undefined8 *puStack_ca0;
  undefined8 *puStack_c98;
  uint *puStack_c90;
  code *pcStack_c88;
  undefined8 *puStack_c08;
  undefined8 *puStack_c00;
  undefined8 *puStack_bf8;
  int iStack_bec;
  undefined8 *puStack_be8;
  void *pvStack_be0;
  undefined8 *puStack_bd8;
  long lStack_bd0;
  uint uStack_bc4;
  char acStack_bc0 [32];
  char acStack_ba0 [32];
  undefined8 uStack_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 uStack_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 auStack_ab8 [648];
  undefined8 *puStack_830;
  int *piStack_828;
  code *apcStack_808 [16];
  int iStack_784;
  int aiStack_780 [52];
  undefined1 auStack_6b0 [648];
  char *pcStack_428;
  code *apcStack_408 [16];
  long alStack_388 [47];
  char *pcStack_210;
  code *apcStack_208 [16];
  long local_188 [47];
  
  local_188[0xf] = 0;
  local_188[0x10] = 0;
  local_188[0xd] = 0;
  local_188[0xe] = 0;
  local_188[0xb] = 0;
  local_188[0xc] = 0;
  local_188[9] = 0;
  local_188[10] = 0;
  local_188[7] = 0;
  local_188[8] = 0;
  local_188[5] = 0;
  local_188[6] = 0;
  local_188[3] = 0;
  local_188[4] = 0;
  local_188[1] = 0x500000003;
  local_188[2] = 5;
  apcStack_208[0] = (code *)0x12ddc3;
  pcVar3 = (char *)bson_as_json(local_188 + 1,local_188);
  apcStack_208[0] = (code *)0x12ddd5;
  iVar1 = strcmp(pcVar3,"{ }");
  if (iVar1 == 0) {
    if (local_188[0] != 3) goto LAB_0012de56;
    apcStack_208[0] = (code *)0x12dde9;
    bson_free(pcVar3);
    apcStack_208[0] = (code *)0x12de0a;
    bson_append_int32(local_188 + 1,"a",1,1);
    apcStack_208[0] = (code *)0x12de17;
    pcVar3 = (char *)bson_as_json(local_188 + 1,local_188);
    apcStack_208[0] = (code *)0x12de29;
    iVar1 = strcmp(pcVar3,"{ \"a\" : 1 }");
    if (iVar1 != 0) goto LAB_0012de5b;
    if (local_188[0] == 0xb) {
      apcStack_208[0] = (code *)0x12de3d;
      bson_free(pcVar3);
      apcStack_208[0] = (code *)0x12de4a;
      bson_destroy(local_188 + 1);
      return;
    }
  }
  else {
    apcStack_208[0] = (code *)0x12de56;
    test_bson_as_json_spacing_cold_1();
LAB_0012de56:
    apcStack_208[0] = (code *)0x12de5b;
    test_bson_as_json_spacing_cold_2();
LAB_0012de5b:
    apcStack_208[0] = (code *)0x12de60;
    test_bson_as_json_spacing_cold_3();
  }
  apcStack_208[0] = test_bson_array_as_json;
  test_bson_as_json_spacing_cold_4();
  alStack_388[0xf] = 0;
  alStack_388[0x10] = 0;
  alStack_388[0xd] = 0;
  alStack_388[0xe] = 0;
  alStack_388[0xb] = 0;
  alStack_388[0xc] = 0;
  alStack_388[9] = 0;
  alStack_388[10] = 0;
  alStack_388[7] = 0;
  alStack_388[8] = 0;
  alStack_388[5] = 0;
  alStack_388[6] = 0;
  alStack_388[3] = 0;
  alStack_388[4] = 0;
  alStack_388[1] = 0x500000003;
  alStack_388[2] = 5;
  apcStack_408[0] = (code *)0x12deba;
  pcStack_210 = pcVar3;
  apcStack_208[0] = (code *)&stack0xfffffffffffffff8;
  pcVar3 = (char *)bson_array_as_json(alStack_388 + 1,alStack_388);
  apcStack_408[0] = (code *)0x12decc;
  iVar1 = strcmp(pcVar3,"[ ]");
  if (iVar1 == 0) {
    if (alStack_388[0] != 3) goto LAB_0012df4d;
    apcStack_408[0] = (code *)0x12dee0;
    bson_free(pcVar3);
    apcStack_408[0] = (code *)0x12df01;
    bson_append_int32(alStack_388 + 1,"0",1,1);
    apcStack_408[0] = (code *)0x12df0e;
    pcVar3 = (char *)bson_array_as_json(alStack_388 + 1,alStack_388);
    apcStack_408[0] = (code *)0x12df20;
    iVar1 = strcmp(pcVar3,"[ 1 ]");
    if (iVar1 != 0) goto LAB_0012df52;
    if (alStack_388[0] == 5) {
      apcStack_408[0] = (code *)0x12df34;
      bson_free(pcVar3);
      apcStack_408[0] = (code *)0x12df41;
      bson_destroy(alStack_388 + 1);
      return;
    }
  }
  else {
    apcStack_408[0] = (code *)0x12df4d;
    test_bson_array_as_json_cold_1();
LAB_0012df4d:
    apcStack_408[0] = (code *)0x12df52;
    test_bson_array_as_json_cold_2();
LAB_0012df52:
    apcStack_408[0] = (code *)0x12df57;
    test_bson_array_as_json_cold_3();
  }
  apcStack_408[0] = test_bson_json_allow_multiple;
  test_bson_array_as_json_cold_4();
  aiStack_780[0x1c] = 0;
  aiStack_780[0x1d] = 0;
  aiStack_780[0x1e] = 0;
  aiStack_780[0x1f] = 0;
  aiStack_780[0x18] = 0;
  aiStack_780[0x19] = 0;
  aiStack_780[0x1a] = 0;
  aiStack_780[0x1b] = 0;
  aiStack_780[0x14] = 0;
  aiStack_780[0x15] = 0;
  aiStack_780[0x16] = 0;
  aiStack_780[0x17] = 0;
  aiStack_780[0x10] = 0;
  aiStack_780[0x11] = 0;
  aiStack_780[0x12] = 0;
  aiStack_780[0x13] = 0;
  aiStack_780[0xc] = 0;
  aiStack_780[0xd] = 0;
  aiStack_780[0xe] = 0;
  aiStack_780[0xf] = 0;
  aiStack_780[8] = 0;
  aiStack_780[9] = 0;
  aiStack_780[10] = 0;
  aiStack_780[0xb] = 0;
  aiStack_780[4] = 0;
  aiStack_780[5] = 0;
  aiStack_780[6] = 0;
  aiStack_780[7] = 0;
  aiStack_780[0] = 3;
  aiStack_780[1] = 5;
  aiStack_780[2] = 5;
  aiStack_780[3] = 0;
  apcStack_808[0] = (code *)0x12dfef;
  pcStack_428 = pcVar3;
  apcStack_408[0] = (code *)apcStack_208;
  __n = (undefined8 *)
        bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,0,0);
  apcStack_808[0] = (code *)0x12e007;
  lVar4 = bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,1,0);
  if (__n == (undefined8 *)0x0) {
    apcStack_808[0] = (code *)0x12e294;
    test_bson_json_allow_multiple_cold_14();
LAB_0012e294:
    apcStack_808[0] = (code *)0x12e299;
    test_bson_json_allow_multiple_cold_13();
LAB_0012e299:
    apcStack_808[0] = (code *)0x12e2b1;
    test_bson_json_allow_multiple_cold_1();
LAB_0012e2b1:
    apcStack_808[0] = (code *)0x12e2b6;
    test_bson_json_allow_multiple_cold_2();
LAB_0012e2b6:
    apcStack_808[0] = (code *)0x12e2ce;
    test_bson_json_allow_multiple_cold_3();
LAB_0012e2ce:
    apcStack_808[0] = (code *)0x12e2d3;
    test_bson_json_allow_multiple_cold_4();
LAB_0012e2d3:
    apcStack_808[0] = (code *)0x12e2eb;
    test_bson_json_allow_multiple_cold_5();
LAB_0012e2eb:
    apcStack_808[0] = (code *)0x12e2f0;
    test_bson_json_allow_multiple_cold_6();
LAB_0012e2f0:
    apcStack_808[0] = (code *)0x12e308;
    test_bson_json_allow_multiple_cold_7();
LAB_0012e308:
    apcStack_808[0] = (code *)0x12e30d;
    test_bson_json_allow_multiple_cold_8();
LAB_0012e30d:
    apcStack_808[0] = (code *)0x12e325;
    test_bson_json_allow_multiple_cold_9();
LAB_0012e325:
    apcStack_808[0] = (code *)0x12e32a;
    test_bson_json_allow_multiple_cold_10();
  }
  else {
    if (lVar4 == 0) goto LAB_0012e294;
    apcStack_808[0] = (code *)0x12e034;
    iVar1 = bson_json_reader_read(__n,aiStack_780,auStack_6b0);
    if (iVar1 != 1) goto LAB_0012e299;
    apcStack_808[0] = (code *)0x12e042;
    uVar5 = bson_bcone_magic();
    unaff_R12 = &iStack_784;
    apcStack_808[0] = (code *)0x12e06e;
    bcon_extract(aiStack_780,"a",uVar5,0xf,unaff_R12,0);
    if (iStack_784 != 1) goto LAB_0012e2b1;
    unaff_R12 = aiStack_780;
    apcStack_808[0] = (code *)0x12e08b;
    bson_reinit(unaff_R12);
    apcStack_808[0] = (code *)0x12e09e;
    iVar1 = bson_json_reader_read(__n,unaff_R12,auStack_6b0);
    if (iVar1 != 1) goto LAB_0012e2b6;
    unaff_R12 = &iStack_784;
    apcStack_808[0] = (code *)0x12e0d0;
    bcon_extract(aiStack_780,"b",uVar5,0xf,unaff_R12,0);
    if (iStack_784 != 1) goto LAB_0012e2ce;
    unaff_R12 = aiStack_780;
    apcStack_808[0] = (code *)0x12e0ed;
    bson_reinit(unaff_R12);
    apcStack_808[0] = (code *)0x12e100;
    iVar1 = bson_json_reader_read(__n,unaff_R12,auStack_6b0);
    if (iVar1 != 1) goto LAB_0012e2d3;
    unaff_R12 = &iStack_784;
    apcStack_808[0] = (code *)0x12e132;
    bcon_extract(aiStack_780,"a",uVar5,0xf,unaff_R12,0);
    if (iStack_784 != 1) goto LAB_0012e2eb;
    unaff_R12 = aiStack_780;
    apcStack_808[0] = (code *)0x12e14f;
    bson_reinit(unaff_R12);
    apcStack_808[0] = (code *)0x12e162;
    iVar1 = bson_json_reader_read(lVar4,unaff_R12,auStack_6b0);
    if (iVar1 != 1) goto LAB_0012e2f0;
    unaff_R12 = &iStack_784;
    apcStack_808[0] = (code *)0x12e194;
    bcon_extract(aiStack_780,"a",uVar5,0xf,unaff_R12,0);
    if (iStack_784 != 1) goto LAB_0012e308;
    unaff_R12 = aiStack_780;
    apcStack_808[0] = (code *)0x12e1b1;
    bson_reinit(unaff_R12);
    apcStack_808[0] = (code *)0x12e1c4;
    iVar1 = bson_json_reader_read(lVar4,unaff_R12,auStack_6b0);
    if (iVar1 != 1) goto LAB_0012e30d;
    unaff_R12 = &iStack_784;
    apcStack_808[0] = (code *)0x12e1f6;
    bcon_extract(aiStack_780,"b",uVar5,0xf,unaff_R12,0);
    if (iStack_784 != 1) goto LAB_0012e325;
    unaff_R12 = aiStack_780;
    apcStack_808[0] = (code *)0x12e213;
    bson_reinit(unaff_R12);
    apcStack_808[0] = (code *)0x12e226;
    iVar1 = bson_json_reader_read(lVar4,unaff_R12,auStack_6b0);
    if (iVar1 == 1) {
      unaff_R12 = &iStack_784;
      apcStack_808[0] = (code *)0x12e258;
      bcon_extract(aiStack_780,"a",uVar5,0xf,unaff_R12,0);
      if (iStack_784 == 1) {
        apcStack_808[0] = (code *)0x12e26d;
        bson_json_reader_destroy(__n);
        apcStack_808[0] = (code *)0x12e275;
        bson_json_reader_destroy(lVar4);
        apcStack_808[0] = (code *)0x12e282;
        bson_destroy(aiStack_780);
        return;
      }
      goto LAB_0012e342;
    }
  }
  apcStack_808[0] = (code *)0x12e342;
  test_bson_json_allow_multiple_cold_11();
LAB_0012e342:
  apcStack_808[0] = test_bson_json_read_buffering;
  test_bson_json_allow_multiple_cold_12();
  uStack_b10 = 0;
  uStack_b08 = 0;
  uStack_b20 = 0;
  uStack_b18 = 0;
  uStack_b30 = 0;
  uStack_b28 = 0;
  uStack_b40 = 0;
  uStack_b38 = 0;
  uStack_b50 = 0;
  uStack_b48 = 0;
  uStack_b60 = 0;
  uStack_b58 = 0;
  uStack_b70 = 0;
  uStack_b68 = 0;
  uStack_b80 = 0x500000003;
  uStack_b78 = 5;
  __seed = &uStack_bc4;
  uStack_bc4 = 0x2a;
  pcStack_c88 = (code *)0x12e3b0;
  puStack_830 = __n;
  piStack_828 = unaff_R12;
  apcStack_808[0] = (code *)apcStack_408;
  puStack_c00 = (undefined8 *)bson_string_new(0);
  puVar13 = (undefined8 *)0x1;
LAB_0012e3be:
  lStack_bd0 = (long)puVar13 * 8;
  iVar1 = 0;
  puStack_bd8 = puVar13;
LAB_0012e3d8:
  pcStack_c88 = (code *)0x12e3e4;
  iStack_bec = iVar1;
  puVar6 = (undefined8 *)bson_malloc(lStack_bd0);
  puVar14 = (undefined8 *)0x0;
  puStack_c08 = puVar6;
  do {
    pcStack_c88 = (code *)0x12e3f4;
    uVar5 = bson_new();
    puVar6[(long)puVar14] = uVar5;
    pcStack_c88 = (code *)0x12e400;
    iVar1 = rand_r(__seed);
    if (0 < iVar1 % 5) {
      __n = (undefined8 *)0x0;
      do {
        uVar5 = puStack_c08[(long)puVar14];
        pcStack_c88 = (code *)0x12e439;
        iVar2 = rand_r(__seed);
        uVar10 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar10 != 0) {
          uVar7 = 0;
          do {
            acStack_bc0[uVar7] = (char)uVar7 + 'a';
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar10);
        }
        acStack_bc0[uVar10] = '\0';
        pcStack_c88 = (code *)0x12e480;
        iVar2 = rand_r(__seed);
        uVar10 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar10 != 0) {
          uVar7 = 0;
          do {
            acStack_ba0[uVar7] = (char)uVar7 + 'a';
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar10);
        }
        acStack_ba0[uVar10] = '\0';
        pcStack_c88 = (code *)0x12e4e2;
        bson_append_utf8(uVar5,acStack_bc0,0xffffffff,acStack_ba0,0xffffffff);
        uVar5 = puStack_c08[(long)puVar14];
        pcStack_c88 = (code *)0x12e4f3;
        iVar2 = rand_r(__seed);
        uVar10 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar10 != 0) {
          uVar7 = 0;
          do {
            acStack_bc0[uVar7] = (char)uVar7 + 'a';
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar10);
        }
        acStack_bc0[uVar10] = '\0';
        pcStack_c88 = (code *)0x12e53a;
        iVar2 = rand_r(__seed);
        pcStack_c88 = (code *)0x12e56f;
        bson_append_int32(uVar5,acStack_bc0,0xffffffff,
                          iVar2 + ((int)((long)iVar2 * 0x40000001 >> 0x3d) - (iVar2 >> 0x1f)) *
                                  -0x7fffffff);
        uVar11 = (int)__n + 1;
        __n = (undefined8 *)(ulong)uVar11;
      } while (uVar11 != iVar1 % 5);
    }
    puVar6 = puStack_c08;
    pcStack_c88 = (code *)0x12e58a;
    lVar4 = bson_as_json(puStack_c08[(long)puVar14],0);
    if (lVar4 == 0) goto LAB_0012e787;
    pcStack_c88 = (code *)0x12e5a6;
    bson_string_append(puStack_c00);
    pcStack_c88 = (code *)0x12e5ae;
    bson_free(lVar4);
    puVar13 = puStack_bd8;
    puVar14 = (undefined8 *)((long)puVar14 + 1);
  } while (puVar14 != puStack_bd8);
  pcStack_c88 = (code *)0x12e5ca;
  iVar1 = rand_r(__seed);
  pcStack_c88 = (code *)0x12e5f6;
  puVar14 = (undefined8 *)bson_json_data_reader_new(1,(ulong)(long)iVar1 % 100);
  pcStack_c88 = (code *)0x12e60f;
  bson_json_data_reader_ingest(puVar14,*puStack_c00,*(undefined4 *)(puStack_c00 + 1));
  puVar12 = (undefined8 *)0x0;
  while( true ) {
    __n = &uStack_b80;
    pcStack_c88 = (code *)0x12e629;
    puStack_bf8 = puVar12;
    bson_reinit(__n);
    pcStack_c88 = (code *)0x12e63c;
    iVar1 = bson_json_reader_read(puVar14,__n,auStack_ab8);
    if (iVar1 == -1) break;
    puVar15 = puVar6;
    if (iVar1 == 0) goto LAB_0012e8cc;
    pcStack_c88 = (code *)0x12e655;
    puStack_be8 = (undefined8 *)bson_get_data(__n);
    __n = puStack_bf8;
    pcStack_c88 = (code *)0x12e66e;
    pvStack_be0 = (void *)bson_get_data(puVar6[(long)puStack_bf8]);
    if (*(int *)(puVar6[(long)__n] + 4) != uStack_b80._4_4_) goto LAB_0012e78c;
    pcStack_c88 = (code *)0x12e68f;
    __s1 = (void *)bson_get_data();
    pcStack_c88 = (code *)0x12e69f;
    __s2 = (void *)bson_get_data(&uStack_b80);
    pcStack_c88 = (code *)0x12e6b1;
    iVar1 = bcmp(__s1,__s2,(ulong)*(uint *)(puVar6[(long)__n] + 4));
    puVar13 = puStack_bd8;
    if (iVar1 != 0) goto LAB_0012e78c;
    puVar12 = (undefined8 *)((long)__n + 1);
    __n = &uStack_b80;
    if (puStack_bd8 == puVar12) goto code_r0x0012e6d8;
  }
  pcStack_c88 = (code *)0x12e787;
  test_bson_json_read_buffering_cold_2();
LAB_0012e787:
  pcStack_c88 = (code *)0x12e78c;
  test_bson_json_read_buffering_cold_9();
LAB_0012e78c:
  __seed = (uint *)&uStack_b80;
  pcStack_c88 = (code *)0x12e79e;
  uVar5 = bson_as_canonical_extended_json(__seed,0);
  pcStack_c88 = (code *)0x12e7af;
  uVar8 = bson_as_canonical_extended_json(puVar6[(long)__n],0);
  puVar12 = puStack_be8;
  uVar10 = 0xffffffff;
  if (uStack_b80._4_4_ == 0) goto LAB_0012e7f9;
  uVar7 = 0;
  goto LAB_0012e7e0;
  while( true ) {
    if (*(char *)((long)puStack_be8 + uVar7) != *(char *)((long)pvStack_be0 + uVar7)) {
      uVar10 = uVar7 & 0xffffffff;
      break;
    }
    uVar7 = uVar7 + 1;
    if (uStack_b80._4_4_ == (uint)uVar7) break;
LAB_0012e7e0:
    if (*(int *)(puVar6[(long)__n] + 4) == (int)uVar7) break;
  }
LAB_0012e7f9:
  if ((int)uVar10 == -1) {
    uVar11 = uStack_b80._4_4_;
    if (uStack_b80._4_4_ < *(uint *)(puStack_c08[(long)puStack_bf8] + 4)) {
      uVar11 = *(uint *)(puStack_c08[(long)puStack_bf8] + 4);
    }
    uVar10 = (ulong)(uVar11 - 1);
  }
  pcStack_c88 = (code *)0x12e839;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar5,uVar8);
  pcStack_c88 = (code *)0x12e851;
  uVar11 = open("failure.bad.bson",0x42,0x1a0);
  puVar15 = (undefined8 *)(ulong)uVar11;
  pcStack_c88 = (code *)0x12e86c;
  __fd = open("failure.expected.bson",0x42,0x1a0);
  __n = puVar12;
  puVar13 = puVar6;
  if (uVar11 == 0xffffffff) {
LAB_0012e8d1:
    pcStack_c88 = (code *)0x12e8d6;
    test_bson_json_read_buffering_cold_7();
LAB_0012e8d6:
    pcStack_c88 = (code *)0x12e8db;
    test_bson_json_read_buffering_cold_6();
LAB_0012e8db:
    pcStack_c88 = (code *)0x12e8e0;
    test_bson_json_read_buffering_cold_3();
  }
  else {
    __seed = (uint *)(ulong)__fd;
    if (__fd == 0xffffffff) goto LAB_0012e8d6;
    puVar13 = (undefined8 *)(uStack_b80 >> 0x20);
    pcStack_c88 = (code *)0x12e890;
    puVar6 = (undefined8 *)write(uVar11,puVar12,(size_t)puVar13);
    if (puVar6 != puVar13) goto LAB_0012e8db;
    __n = (undefined8 *)(ulong)*(uint *)(puStack_c08[(long)puStack_bf8] + 4);
    pcStack_c88 = (code *)0x12e8bc;
    puVar6 = (undefined8 *)write(__fd,pvStack_be0,(size_t)__n);
    if (puVar6 == __n) {
      pcStack_c88 = (code *)0x12e8cc;
      test_bson_json_read_buffering_cold_5();
LAB_0012e8cc:
      pcStack_c88 = (code *)0x12e8d1;
      test_bson_json_read_buffering_cold_1();
      goto LAB_0012e8d1;
    }
  }
  pcStack_c88 = (code *)0x12e8e5;
  test_bson_json_read_buffering_cold_4();
  goto LAB_0012e8e5;
code_r0x0012e6d8:
  pcStack_c88 = (code *)0x12e6eb;
  iVar1 = bson_json_reader_read(puVar14,__n,auStack_ab8);
  if (iVar1 != 0) {
LAB_0012e8e5:
    pcStack_c88 = test_bson_json_read;
    test_bson_json_read_buffering_cold_8();
    puStack_cb0 = __n;
    puStack_ca8 = puVar13;
    puStack_ca0 = puVar14;
    puStack_c98 = puVar15;
    puStack_c90 = __seed;
    pcStack_c88 = (code *)apcStack_808;
    bson_oid_init_from_string(auStack_cbc,"000000000000000000000000");
    uVar5 = bson_bcon_magic();
    uVar8 = bcon_new(0x1a9fbe77,0,"foo","bar","bar",uVar5,0xf,0x3035,"baz",uVar5,1,"map","{","a",
                     uVar5,0xf,1,"}","array","[",uVar5,0xf,1,uVar5,0xf,2,uVar5,0xf,3,uVar5,0xf,4,"]"
                     ,"null",uVar5,9,"boolean",uVar5,7,1,"oid",uVar5,6,auStack_cbc,"binary",uVar5,4,
                     0,"deadbeef",8,"regex",uVar5,10,"foo|bar","ism","date",uVar5,8,10000,"ref","{",
                     "$ref",uVar5,0,"foo","$id",uVar5,6,auStack_cbc);
    uVar9 = bcon_new(0,"after","b",0);
    iVar1 = 0x147e7e;
    uVar5 = bcon_new(0,"twice",uVar5,7,1,0);
    _test_bson_json_read_compare
              ("{ \n      \"foo\" : \"bar\", \n      \"bar\" : 12341, \n      \"baz\" : 123.456, \n      \"map\" : { \"a\" : 1 }, \n      \"array\" : [ 1, 2, 3, 4 ], \n      \"null\" : null, \n      \"boolean\" : true, \n      \"oid\" : { \n        \"$oid\" : \"000000000000000000000000\" \n      }, \n      \"binary\" : { \n        \"$type\" : \"00\", \n        \"$binary\" : \"ZGVhZGJlZWY=\" \n      }, \n      \"regex\" : { \n        \"$regularExpression\" : { \n          \"pattern\": \"foo|bar\", \"options\" : \"ism\" \n        } \n      }, \n      \"date\" : { \n        \"$date\" : \"1970-01-01T00:00:10Z\" \n      }, \n      \"ref\" : { \n        \"$ref\" : \"foo\", \n        \"$id\" : {\"$oid\": \"000000000000000000000000\"} \n      }, \n      \"undefined\" : { \n        \"$undefined\" : true \n      }, \n      \"minkey\" : { \n        \"$minKey\" : 1 \n      }, \n      \"maxkey\" : { \n        \"$maxKey\" : 1 \n      }, \n      \"timestamp\" : { \n        \"$timestamp\" : { \n           \"t\" : 100, \n           \"i\" : 1000 \n        } \n      } \n   } { \"after\": \"b\" } { \"twice\" : true }"
               ,iVar1,uVar8,uVar9,uVar5,0);
    return;
  }
  pcStack_c88 = (code *)0x12e6fb;
  bson_json_reader_destroy(puVar14);
  pcStack_c88 = (code *)0x12e70a;
  bson_string_truncate(puStack_c00);
  __n = (undefined8 *)0x0;
  do {
    pcStack_c88 = (code *)0x12e715;
    bson_destroy(puVar6[(long)__n]);
    __n = (undefined8 *)((long)__n + 1);
  } while (puVar13 != __n);
  pcStack_c88 = (code *)0x12e725;
  bson_free(puVar6);
  iVar1 = iStack_bec + 1;
  if (iVar1 == 0x32) goto code_r0x0012e73f;
  goto LAB_0012e3d8;
code_r0x0012e73f:
  puVar13 = (undefined8 *)((long)puVar13 + 1);
  if (puVar13 == (undefined8 *)0xa) {
    pcStack_c88 = (code *)0x12e75e;
    bson_string_free(puStack_c00,1);
    pcStack_c88 = (code *)0x12e76b;
    bson_destroy(&uStack_b80);
    return;
  }
  goto LAB_0012e3be;
}

Assistant:

static void
test_bson_as_json_spacing (void)
{
   bson_t d = BSON_INITIALIZER;
   size_t len;
   char *str;

   str = bson_as_json (&d, &len);
   BSON_ASSERT (0 == strcmp (str, "{ }"));
   BSON_ASSERT (len == 3);
   bson_free (str);

   BSON_APPEND_INT32 (&d, "a", 1);
   str = bson_as_json (&d, &len);
   BSON_ASSERT (0 == strcmp (str, "{ \"a\" : 1 }"));
   BSON_ASSERT (len == 11);
   bson_free (str);

   bson_destroy (&d);
}